

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O1

void __thiscall
Parser::printMsg(Parser *this,QByteArrayView formatStringSuffix,QByteArrayView msg,Symbol *sym)

{
  FILE *pFVar1;
  reference pQVar2;
  char *pcVar3;
  char *pcVar4;
  long in_FS_OFFSET;
  QStringBuilder<const_char_(&)[11],_QByteArrayView_&> local_78;
  QByteArray local_68;
  QByteArrayView local_48;
  long local_38;
  
  local_48.m_data = formatStringSuffix.m_data;
  local_48.m_size = formatStringSuffix.m_size;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (sym->lineNum == -1) {
    local_68.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_68.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_68.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
    local_78.a = (char (*) [11])0x17a6f2;
    local_78.b = &local_48;
    QStringBuilder<const_char_(&)[5],_QByteArrayView_&>::convertTo<QByteArray>
              (&local_68,(QStringBuilder<const_char_(&)[5],_QByteArrayView_&> *)&local_78);
    pFVar1 = _stderr;
    pcVar4 = local_68.d.ptr;
    if (local_68.d.ptr == (char *)0x0) {
      pcVar4 = "";
    }
    pQVar2 = std::stack<QByteArray,_QList<QByteArray>_>::top(&this->currentFilenames);
    pcVar3 = (pQVar2->d).ptr;
    if (pcVar3 == (char *)0x0) {
      pcVar3 = "";
    }
    fprintf(pFVar1,pcVar4,pcVar3,msg.m_data);
  }
  else {
    local_68.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_68.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_68.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
    local_78.a = (char (*) [11])0x17d2b8;
    local_78.b = &local_48;
    QStringBuilder<const_char_(&)[11],_QByteArrayView_&>::convertTo<QByteArray>(&local_68,&local_78)
    ;
    pFVar1 = _stderr;
    pcVar4 = local_68.d.ptr;
    if (local_68.d.ptr == (char *)0x0) {
      pcVar4 = "";
    }
    pQVar2 = std::stack<QByteArray,_QList<QByteArray>_>::top(&this->currentFilenames);
    pcVar3 = (pQVar2->d).ptr;
    if (pcVar3 == (char *)0x0) {
      pcVar3 = "";
    }
    fprintf(pFVar1,pcVar4,pcVar3,(ulong)(uint)sym->lineNum,1,msg.m_data);
  }
  if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,1,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Parser::printMsg(QByteArrayView formatStringSuffix, QByteArrayView msg, const Symbol &sym)
{
    if (sym.lineNum != -1) {
#ifdef Q_CC_MSVC
        QByteArray formatString = "%s(%d:%d): " + formatStringSuffix;
#else
        QByteArray formatString = "%s:%d:%d: " + formatStringSuffix;
#endif
        fprintf(stderr, formatString.constData(),
                currentFilenames.top().constData(), sym.lineNum, 1, msg.data());
    } else {
        QByteArray formatString = "%s: " + formatStringSuffix;
        fprintf(stderr, formatString.constData(),
                currentFilenames.top().constData(), msg.data());
    }
}